

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StreamReader.h
# Opt level: O2

void __thiscall Assimp::StreamReader<false,_false>::InternBegin(StreamReader<false,_false> *this)

{
  element_type *peVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int8_t *piVar4;
  undefined4 extraout_var_01;
  DeadlyImportError *pDVar5;
  ulong uVar6;
  allocator local_39;
  string local_38;
  
  peVar1 = (this->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 == (element_type *)0x0) {
    pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_38,"StreamReader: Unable to open file",&local_39);
    DeadlyImportError::DeadlyImportError(pDVar5,&local_38);
    __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar2 = (*peVar1->_vptr_IOStream[6])();
  iVar3 = (*((this->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ->_vptr_IOStream[5])();
  uVar6 = CONCAT44(extraout_var,iVar2) - CONCAT44(extraout_var_00,iVar3);
  if (uVar6 != 0) {
    piVar4 = (int8_t *)operator_new__(uVar6);
    this->buffer = piVar4;
    this->current = piVar4;
    peVar1 = (this->stream).super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar2 = (*peVar1->_vptr_IOStream[2])(peVar1,piVar4,1,uVar6);
    if (CONCAT44(extraout_var_01,iVar2) <= uVar6) {
      this->limit = this->buffer + CONCAT44(extraout_var_01,iVar2);
      this->end = this->buffer + CONCAT44(extraout_var_01,iVar2);
      return;
    }
    __assert_fail("read <= s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/include/assimp/StreamReader.h"
                  ,0x13d,
                  "void Assimp::StreamReader<>::InternBegin() [SwapEndianess = false, RuntimeSwitch = false]"
                 );
  }
  pDVar5 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string
            ((string *)&local_38,"StreamReader: File is empty or EOF is already reached",&local_39);
  DeadlyImportError::DeadlyImportError(pDVar5,&local_38);
  __cxa_throw(pDVar5,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void InternBegin() {
        if (!stream) {
            // in case someone wonders: StreamReader is frequently invoked with
            // no prior validation whether the input stream is valid. Since
            // no one bothers changing the error message, this message here
            // is passed down to the caller and 'unable to open file'
            // simply describes best what happened.
            throw DeadlyImportError("StreamReader: Unable to open file");
        }

        const size_t s = stream->FileSize() - stream->Tell();
        if (!s) {
            throw DeadlyImportError("StreamReader: File is empty or EOF is already reached");
        }

        current = buffer = new int8_t[s];
        const size_t read = stream->Read(current,1,s);
        // (read < s) can only happen if the stream was opened in text mode, in which case FileSize() is not reliable
        ai_assert(read <= s);
        end = limit = &buffer[read-1] + 1;
    }